

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

cbtVector3 PlaneProject(cbtPlane *plane,cbtVector3 *point)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cbtVector3 cVar11;
  
  uVar2 = *(ulong *)point->m_floats;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  uVar3 = *(ulong *)(plane->normal).m_floats;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  fVar1 = (plane->normal).m_floats[2];
  auVar10._0_4_ = (float)uVar2 * (float)uVar3;
  fVar5 = (float)(uVar3 >> 0x20);
  auVar10._4_4_ = (float)(uVar2 >> 0x20) * fVar5;
  auVar10._8_8_ = 0;
  auVar9 = vmovshdup_avx(auVar10);
  auVar9 = vfmadd231ss_fma(auVar9,auVar7,auVar8);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)point->m_floats[2]),ZEXT416((uint)fVar1));
  fVar4 = auVar9._0_4_ + plane->dist;
  auVar9._0_4_ = (float)uVar3 * fVar4;
  auVar9._4_4_ = fVar5 * fVar4;
  auVar9._8_4_ = fVar4 * 0.0;
  auVar9._12_4_ = fVar4 * 0.0;
  auVar9 = vsubps_avx(auVar7,auVar9);
  auVar6._4_12_ = SUB1612(ZEXT416(0),0);
  auVar6._0_4_ = point->m_floats[2] - fVar1 * fVar4;
  cVar11.m_floats._0_8_ = auVar9._0_8_;
  cVar11.m_floats._8_8_ = auVar6._0_8_;
  return (cbtVector3)cVar11.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}